

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor-xor-rle-per-draw-list-with-vtx-offset.cpp
# Opt level: O0

bool __thiscall
ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::setDrawData
          (XorRlePerDrawListWithVtxOffset *this,ImDrawData *drawData)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  size_type sVar4;
  reference this_00;
  size_type sVar5;
  char *pcVar6;
  long in_RSI;
  long in_RDI;
  vector<char,_std::allocator<char>_> *in_stack_00000058;
  ImDrawList *in_stack_00000060;
  uint32_t k;
  uint32_t i_1;
  int i;
  uint32_t n;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  value_type *bufferPrev;
  int32_t type;
  value_type *bufferDiff;
  value_type *bufferCur;
  uint32_t iList_1;
  uint32_t iList;
  uint32_t nCmdLists;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffec8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffed0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffed8;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int local_84;
  int local_80;
  undefined1 local_7c [8];
  uint local_74;
  reference local_70;
  vector<char,_std::allocator<char>_> *local_68;
  vector<char,_std::allocator<char>_> *local_60;
  char *local_58;
  char *local_50;
  vector<char,_std::allocator<char>_> *local_48;
  vector<char,_std::allocator<char>_> *local_40;
  int local_34;
  reference local_30;
  reference local_28;
  uint local_1c;
  uint local_18;
  uint local_14;
  long local_10;
  
  local_10 = in_RSI;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::operator=((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
              in_stack_ffffffffffffff48);
  local_14 = *(uint *)(local_10 + 4);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::resize((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffed0._M_current,(size_type)in_stack_fffffffffffffec8.container);
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  *)(in_RDI + 8),(ulong)local_18);
    std::vector<char,_std::allocator<char>_>::clear((vector<char,_std::allocator<char>_> *)0x1d92f7)
    ;
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  *)(in_RDI + 8),(ulong)local_18);
    anon_unknown.dwarf_824a7::writeCmdListToBuffer(in_stack_00000060,in_stack_00000058);
  }
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::clear((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           *)0x1d935b);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::resize((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffed0._M_current,(size_type)in_stack_fffffffffffffec8.container);
  local_1c = 0;
  do {
    if (local_14 <= local_1c) {
      return true;
    }
    local_28 = std::
               vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                             *)(in_RDI + 8),(ulong)local_1c);
    local_30 = std::
               vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                             *)(in_RDI + 0x38),(ulong)local_1c);
    std::vector<char,_std::allocator<char>_>::clear((vector<char,_std::allocator<char>_> *)0x1d93dc)
    ;
    local_34 = 1;
    uVar3 = (ulong)local_1c;
    sVar4 = std::
            vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            ::size((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x20));
    if (uVar3 < sVar4) {
      this_00 = std::
                vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                              *)(in_RDI + 0x20),(ulong)local_1c);
      sVar4 = std::vector<char,_std::allocator<char>_>::size(this_00);
      sVar5 = std::vector<char,_std::allocator<char>_>::size(local_28);
      if (sVar4 != sVar5) goto LAB_001d944c;
    }
    else {
LAB_001d944c:
      local_34 = 0;
    }
    local_40 = (vector<char,_std::allocator<char>_> *)
               std::back_inserter<std::vector<char,std::allocator<char>>>(in_stack_fffffffffffffea8)
    ;
    local_48 = (vector<char,_std::allocator<char>_> *)
               std::copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                         (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                          in_stack_fffffffffffffec8);
    if (local_34 == 0) {
      local_50 = (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffea8);
      local_58 = (char *)std::vector<char,_std::allocator<char>_>::end(in_stack_fffffffffffffea8);
      local_60 = (vector<char,_std::allocator<char>_> *)
                 std::back_inserter<std::vector<char,std::allocator<char>>>
                           (in_stack_fffffffffffffea8);
      local_68 = (vector<char,_std::allocator<char>_> *)
                 std::
                 copy<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                           (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                            in_stack_fffffffffffffec8);
    }
    else if (local_34 == 1) {
      local_70 = std::
                 vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                               *)(in_RDI + 0x20),(ulong)local_1c);
      local_74 = 0;
      local_7c._4_4_ = 0;
      local_7c._0_4_ = 0;
      local_80 = 0;
      for (local_84 = 0; sVar4 = std::vector<char,_std::allocator<char>_>::size(local_28),
          local_84 < (int)sVar4; local_84 = local_84 + 4) {
        pcVar6 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x1d95aa);
        local_74 = *(uint *)(pcVar6 + local_84);
        pcVar6 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x1d95c9);
        local_7c._4_4_ = *(undefined4 *)(pcVar6 + local_84);
        local_74 = local_74 ^ local_7c._4_4_;
        if (local_74 == local_7c._0_4_) {
          local_80 = local_80 + 1;
        }
        else {
          if (local_80 != 0) {
            in_stack_fffffffffffffed0._M_current = local_7c;
            std::back_inserter<std::vector<char,std::allocator<char>>>(in_stack_fffffffffffffea8);
            std::copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                      (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffec8
                      );
            in_stack_fffffffffffffed8._M_current = local_7c + 4;
            std::back_inserter<std::vector<char,std::allocator<char>>>(in_stack_fffffffffffffea8);
            std::copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                      (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffec8
                      );
          }
          local_80 = 1;
          local_7c._0_4_ = local_74;
        }
      }
      sVar4 = std::vector<char,_std::allocator<char>_>::size(local_28);
      if ((sVar4 & 3) != 0) {
        local_74 = 0;
        local_7c._4_4_ = 0;
        sVar4 = std::vector<char,_std::allocator<char>_>::size(local_28);
        uVar1 = (uint)sVar4 & 0xfffffffc;
        sVar4 = std::vector<char,_std::allocator<char>_>::size(local_28);
        uVar2 = (int)sVar4 - uVar1;
        pcVar6 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x1d975d);
        memcpy(&local_74,pcVar6 + uVar1,(ulong)uVar2);
        pcVar6 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x1d978d);
        memcpy(local_7c + 4,pcVar6 + uVar1,(ulong)uVar2);
        local_74 = local_74 ^ local_7c._4_4_;
        if (local_74 != local_7c._0_4_) {
          in_stack_fffffffffffffec0 = local_7c;
          std::back_inserter<std::vector<char,std::allocator<char>>>(in_stack_fffffffffffffea8);
          std::copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffec8);
          in_stack_fffffffffffffec8.container =
               (vector<char,_std::allocator<char>_> *)(local_7c + 4);
          std::back_inserter<std::vector<char,std::allocator<char>>>(in_stack_fffffffffffffea8);
          std::copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffec8);
          local_7c._0_4_ = local_74;
        }
      }
      std::back_inserter<std::vector<char,std::allocator<char>>>(in_stack_fffffffffffffea8);
      std::copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffec8);
      in_stack_fffffffffffffeb8 = local_7c + 4;
      std::back_inserter<std::vector<char,std::allocator<char>>>(in_stack_fffffffffffffea8);
      std::copy<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffec8);
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool XorRlePerDrawListWithVtxOffset::setDrawData(const ::ImDrawData * drawData) {
    m_drawListsPrev = m_drawListsCur;

    uint32_t nCmdLists = drawData->CmdListsCount;
    m_drawListsCur.resize(nCmdLists);

    for (uint32_t iList = 0; iList < nCmdLists; iList++) {
        m_drawListsCur[iList].clear();
        ::writeCmdListToBuffer(drawData->CmdLists[iList], m_drawListsCur[iList]);
    }

    // calculate diff

    m_drawListsDiff.clear();
    m_drawListsDiff.resize(nCmdLists);

    for (uint32_t iList = 0; iList < nCmdLists; ++iList) {
        auto & bufferCur = m_drawListsCur[iList];
        auto & bufferDiff = m_drawListsDiff[iList];

        bufferDiff.clear();

        int32_t type = 1; // Run-Length Encoding
        if (iList >= m_drawListsPrev.size() || m_drawListsPrev[iList].size() != bufferCur.size()) {
            type = 0; // Full update
        }

        std::copy((char *)(&type), (char *)(&type) + sizeof(type), std::back_inserter(bufferDiff));

        if (type == 0) {
            std::copy(bufferCur.begin(), bufferCur.end(), std::back_inserter(bufferDiff));
        } else if (type == 1) {
            auto & bufferPrev = m_drawListsPrev[iList];

            uint32_t a = 0;
            uint32_t b = 0;
            uint32_t c = 0;
            uint32_t n = 0;

            for (int i = 0; i < (int) bufferCur.size(); i += 4) {
                std::memcpy((char *)(&a), bufferPrev.data() + i, sizeof(uint32_t));
                std::memcpy((char *)(&b), bufferCur.data() + i, sizeof(uint32_t));
                a = a ^ b;
                if (a == c) {
                    ++n;
                } else {
                    if (n > 0) {
                        std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                        std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                    }
                    n = 1;
                    c = a;
                }
            }

            if (bufferCur.size() % 4 != 0) {
                a = 0;
                b = 0;
                uint32_t i = (bufferCur.size()/4)*4;
                uint32_t k = bufferCur.size() - i;
                std::memcpy((char *)(&a), bufferPrev.data() + i, k);
                std::memcpy((char *)(&b), bufferCur.data() + i, k);
                a = a ^ b;
                if (a == c) {
                    ++n;
                } else {
                    std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                    std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                    n = 1;
                    c = a;
                }
            }

            std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(bufferDiff));
            std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(bufferDiff));
        }
    }

    return true;
}